

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

bool double_conversion::IsHexFloatString<unsigned_short_const*>
               (unsigned_short *start,unsigned_short *end,uc16 separator,bool allow_trailing_junk)

{
  bool bVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  unsigned_short *current;
  ushort *local_48;
  unsigned_short *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,allow_trailing_junk);
  bVar2 = false;
  local_48 = start;
  local_40 = end;
  do {
    uVar3 = *local_48;
    if (0x3f < uVar3 || 9 < uVar3 - 0x30) {
      uVar4 = uVar3 - 0x2e;
      if (0x38 < uVar4) goto LAB_003e0d1a;
      if ((0x1f8000001f80000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
        if ((ulong)uVar4 == 0) {
          bVar1 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
          if (bVar1) {
            return false;
          }
          while( true ) {
            uVar3 = *local_48;
            if ((0x3f < uVar3 || 9 < uVar3 - 0x30) &&
               ((uVar4 = uVar3 - 0x41, 0x25 < uVar4 ||
                ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) break;
            bVar1 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
            bVar2 = true;
            if (bVar1) {
              return false;
            }
          }
        }
LAB_003e0d1a:
        if (!bVar2) {
          return false;
        }
        if ((uVar3 | 0x20) != 0x70) {
          return false;
        }
        bVar2 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
        if (bVar2) {
          return false;
        }
        uVar3 = *local_48;
        if ((uVar3 == 0x2d) || (uVar3 == 0x2b)) {
          bVar2 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
          if (bVar2) {
            return false;
          }
          uVar3 = *local_48;
        }
        if (0x39 < uVar3) {
          return false;
        }
        if (9 < uVar3 - 0x30) {
          return false;
        }
        bVar2 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
        if (bVar2) {
          return true;
        }
        while ((*local_48 < 0x3a && (*local_48 - 0x30 < 10))) {
          bVar2 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
          if (bVar2) {
            return true;
          }
        }
        if ((char)local_34 == '\0') {
          bVar2 = AdvanceToNonspace<unsigned_short_const*>(&local_48,end);
          return !bVar2;
        }
        return true;
      }
    }
    bVar1 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
    bVar2 = true;
    if (bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

static bool IsHexFloatString(Iterator start,
                             Iterator end,
                             uc16 separator,
                             bool allow_trailing_junk) {
  DOUBLE_CONVERSION_ASSERT(start != end);

  Iterator current = start;

  bool saw_digit = false;
  while (isDigit(*current, 16)) {
    saw_digit = true;
    if (Advance(&current, separator, 16, end)) return false;
  }
  if (*current == '.') {
    if (Advance(&current, separator, 16, end)) return false;
    while (isDigit(*current, 16)) {
      saw_digit = true;
      if (Advance(&current, separator, 16, end)) return false;
    }
  }
  if (!saw_digit) return false;
  if (*current != 'p' && *current != 'P') return false;
  if (Advance(&current, separator, 16, end)) return false;
  if (*current == '+' || *current == '-') {
    if (Advance(&current, separator, 16, end)) return false;
  }
  if (!isDigit(*current, 10)) return false;
  if (Advance(&current, separator, 16, end)) return true;
  while (isDigit(*current, 10)) {
    if (Advance(&current, separator, 16, end)) return true;
  }
  return allow_trailing_junk || !AdvanceToNonspace(&current, end);
}